

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O3

uint32_t __thiscall cppnet::BufferQueue::Read(BufferQueue *this,char *res,uint32_t len)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  uint32_t uVar5;
  BufferBlock *__tmp;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *local_38;
  
  uVar5 = 0;
  if (((len != 0) && (uVar5 = 0, res != (char *)0x0)) && ((this->_buffer_list)._size != 0)) {
    peVar6 = (this->_buffer_list)._head.
             super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->_buffer_list)._head.
              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    uVar5 = 0;
    do {
      p_Var4 = this_00;
      if (peVar6 == (element_type *)0x0) break;
      iVar3 = (*(peVar6->super_InnerBuffer).super_Buffer._vptr_Buffer[3])
                        (peVar6,res + uVar5,(ulong)(len - uVar5));
      uVar5 = uVar5 + iVar3;
      if (len <= uVar5) break;
      peVar1 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar6 == peVar1) {
        peVar6 = (peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (peVar6 == (element_type *)0x0) goto LAB_00110743;
LAB_001106b7:
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          if (peVar6 == (element_type *)0x0) {
LAB_00110743:
            (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])(this);
            break;
          }
          peVar1 = (this->_buffer_write).
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar6 = (peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var4 = (peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001106b7;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar6;
        p_Var2 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var4;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
      List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)&stack0xffffffffffffffc0);
      if (local_38 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      peVar6 = (this->_buffer_list)._head.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = (this->_buffer_list)._head.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      iVar3 = (*(peVar6->super_InnerBuffer).super_Buffer._vptr_Buffer[8])(peVar6);
      this_00 = p_Var4;
    } while (iVar3 != 0);
    this->_can_read_length = this->_can_read_length - uVar5;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  return uVar5;
}

Assistant:

uint32_t BufferQueue::Read(char* res, uint32_t len) {
    if (_buffer_list.Size() == 0 || !res || len == 0) {
        return 0;
    }

    auto buffer_read = _buffer_list.GetHead();
    uint32_t total_read_len = 0;
    while (buffer_read) {
        total_read_len += buffer_read->Read(res + total_read_len, len - total_read_len);
        if (total_read_len >= len) {
            break;
        }
        if (buffer_read == _buffer_write) {
            if (_buffer_write->GetNext()) {
                _buffer_write = _buffer_write->GetNext();

            } else {
                Reset();
                break;
            }
        }
        _buffer_list.PopFront();
        buffer_read = _buffer_list.GetHead();
        if (buffer_read->GetCanReadLength() == 0) {
            break;
        }
    }
    _can_read_length -= total_read_len;
    return total_read_len;
}